

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryMesh(AssbinExport *this,IOStream *container,aiMesh *mesh)

{
  uint *puVar1;
  aiBone *b;
  uint a_2;
  uint16_t local_ca;
  uint a_1;
  aiFace *f_1;
  uint local_b8;
  uint i_1;
  uint i;
  uint32_t tmp;
  aiFace *f;
  uint a;
  uint32_t hash;
  uint local_98;
  int local_94;
  uint job;
  uint processed;
  uint n_3;
  uint n_2;
  aiVector3D maxVec;
  aiVector3D minVec;
  uint n_1;
  uint n;
  uint c;
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiMesh *mesh_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)mesh;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1237,0x1000);
  Write<unsigned_int>((IOStream *)local_58,(uint *)chunk.initial);
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 4));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 8));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0xd8));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0xe8));
  n_1 = (uint)(*(long *)(chunk.initial + 0x10) != 0);
  if (*(long *)(chunk.initial + 0x18) != 0) {
    n_1 = n_1 | 2;
  }
  if ((*(long *)(chunk.initial + 0x20) != 0) && (*(long *)(chunk.initial + 0x28) != 0)) {
    n_1 = n_1 | 4;
  }
  minVec.z = 0.0;
  while (((uint)minVec.z < 8 && (*(long *)(chunk.initial + 0x70 + (ulong)(uint)minVec.z * 8) != 0)))
  {
    n_1 = 0x100 << (SUB41(minVec.z,0) & 0x1f) | n_1;
    minVec.z = (float)((int)minVec.z + 1);
  }
  minVec.y = 0.0;
  while (((uint)minVec.y < 8 && (*(long *)(chunk.initial + 0x30 + (ulong)(uint)minVec.y * 8) != 0)))
  {
    n_1 = 0x10000 << (SUB41(minVec.y,0) & 0x1f) | n_1;
    minVec.y = (float)((int)minVec.y + 1);
  }
  Write<unsigned_int>((IOStream *)local_58,&n_1);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&maxVec.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&n_3);
  if (*(long *)(chunk.initial + 0x10) != 0) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x10),
                 *(uint *)(chunk.initial + 4));
    }
    else {
      WriteBounds<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x10),
                 *(uint *)(chunk.initial + 4));
    }
  }
  if (*(long *)(chunk.initial + 0x18) != 0) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x18),
                 *(uint *)(chunk.initial + 4));
    }
    else {
      WriteBounds<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x18),
                 *(uint *)(chunk.initial + 4));
    }
  }
  if ((*(long *)(chunk.initial + 0x20) != 0) && (*(long *)(chunk.initial + 0x28) != 0)) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x20),
                 *(uint *)(chunk.initial + 4));
      WriteArray<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x28),
                 *(uint *)(chunk.initial + 4));
    }
    else {
      WriteBounds<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x20),
                 *(uint *)(chunk.initial + 4));
      WriteBounds<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x28),
                 *(uint *)(chunk.initial + 4));
    }
  }
  processed = 0;
  while ((processed < 8 && (*(long *)(chunk.initial + 0x30 + (ulong)processed * 8) != 0))) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiColor4t<float>>
                ((IOStream *)local_58,
                 *(aiColor4t<float> **)(chunk.initial + 0x30 + (ulong)processed * 8),
                 *(uint *)(chunk.initial + 4));
    }
    else {
      WriteBounds<aiColor4t<float>>
                ((IOStream *)local_58,
                 *(aiColor4t<float> **)(chunk.initial + 0x30 + (ulong)processed * 8),
                 *(uint *)(chunk.initial + 4));
    }
    processed = processed + 1;
  }
  job = 0;
  while ((job < 8 && (*(long *)(chunk.initial + 0x70 + (ulong)job * 8) != 0))) {
    Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0xb0 + (ulong)job * 4));
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x70 + (ulong)job * 8)
                 ,*(uint *)(chunk.initial + 4));
    }
    else {
      WriteBounds<aiVector3t<float>>
                ((IOStream *)local_58,*(aiVector3t<float> **)(chunk.initial + 0x70 + (ulong)job * 8)
                 ,*(uint *)(chunk.initial + 4));
    }
    job = job + 1;
  }
  if ((this->shortened & 1U) == 0) {
    for (f_1._4_4_ = 0; f_1._4_4_ < *(uint *)(chunk.initial + 8); f_1._4_4_ = f_1._4_4_ + 1) {
      _a_1 = (uint *)(*(long *)(chunk.initial + 0xd0) + (ulong)f_1._4_4_ * 0x10);
      local_ca = (uint16_t)*_a_1;
      Write<unsigned_short>((IOStream *)local_58,&local_ca);
      for (a_2 = 0; a_2 < *_a_1; a_2 = a_2 + 1) {
        if (*(uint *)(chunk.initial + 4) < 0x10000) {
          b._6_2_ = *(undefined2 *)(*(long *)(_a_1 + 2) + (ulong)a_2 * 4);
          Write<unsigned_short>((IOStream *)local_58,(uint16_t *)((long)&b + 6));
        }
        else {
          Write<unsigned_int>((IOStream *)local_58,(uint *)(*(long *)(_a_1 + 2) + (ulong)a_2 * 4));
        }
      }
    }
  }
  else {
    local_94 = 0;
    while( true ) {
      hash = *(int *)(chunk.initial + 8) - local_94;
      a = 0x200;
      puVar1 = std::min<unsigned_int>(&hash,&a);
      local_98 = *puVar1;
      if (local_98 == 0) break;
      f._4_4_ = 0;
      for (f._0_4_ = 0; (uint)f < local_98; f._0_4_ = (uint)f + 1) {
        _i = (uint *)(*(long *)(chunk.initial + 0xd0) + (ulong)(local_94 + (uint)f) * 0x10);
        i_1 = *_i;
        f._4_4_ = SuperFastHash((char *)&i_1,4,f._4_4_);
        for (local_b8 = 0; local_b8 < *_i; local_b8 = local_b8 + 1) {
          i_1 = *(uint *)(*(long *)(_i + 2) + (ulong)local_b8 * 4);
          f._4_4_ = SuperFastHash((char *)&i_1,4,f._4_4_);
        }
      }
      Write<unsigned_int>((IOStream *)local_58,(uint *)((long)&f + 4));
      local_94 = local_98 + local_94;
    }
    local_98 = 0;
  }
  if (*(int *)(chunk.initial + 0xd8) != 0) {
    for (b._0_4_ = 0; (uint)b < *(uint *)(chunk.initial + 0xd8); b._0_4_ = (uint)b + 1) {
      WriteBinaryBone(this,(IOStream *)local_58,
                      *(aiBone **)(*(long *)(chunk.initial + 0xe0) + (ulong)(uint)b * 8));
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryMesh(IOStream * container, const aiMesh* mesh)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIMESH );

        Write<unsigned int>(&chunk,mesh->mPrimitiveTypes);
        Write<unsigned int>(&chunk,mesh->mNumVertices);
        Write<unsigned int>(&chunk,mesh->mNumFaces);
        Write<unsigned int>(&chunk,mesh->mNumBones);
        Write<unsigned int>(&chunk,mesh->mMaterialIndex);

        // first of all, write bits for all existent vertex components
        unsigned int c = 0;
        if (mesh->mVertices) {
            c |= ASSBIN_MESH_HAS_POSITIONS;
        }
        if (mesh->mNormals) {
            c |= ASSBIN_MESH_HAS_NORMALS;
        }
        if (mesh->mTangents && mesh->mBitangents) {
            c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_TEXCOORD(n);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_COLOR(n);
        }
        Write<unsigned int>(&chunk,c);

        aiVector3D minVec, maxVec;
        if (mesh->mVertices) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mVertices,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mVertices,mesh->mNumVertices);
        }
        if (mesh->mNormals) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mNormals,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mNormals,mesh->mNumVertices);
        }
        if (mesh->mTangents && mesh->mBitangents) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteBounds(&chunk,mesh->mBitangents,mesh->mNumVertices);
            } // else write as usual
            else {
                WriteArray<aiVector3D>(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteArray<aiVector3D>(&chunk,mesh->mBitangents,mesh->mNumVertices);
            }
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n])
                break;

            if (shortened) {
                WriteBounds(&chunk,mesh->mColors[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiColor4D>(&chunk,mesh->mColors[n],mesh->mNumVertices);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n])
                break;

            // write number of UV components
            Write<unsigned int>(&chunk,mesh->mNumUVComponents[n]);

            if (shortened) {
                WriteBounds(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
        }

        // write faces. There are no floating-point calculations involved
        // in these, so we can write a simple hash over the face data
        // to the dump file. We generate a single 32 Bit hash for 512 faces
        // using Assimp's standard hashing function.
        if (shortened) {
            unsigned int processed = 0;
            for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

                uint32_t hash = 0;
                for (unsigned int a = 0; a < job;++a) {

                    const aiFace& f = mesh->mFaces[processed+a];
                    uint32_t tmp = f.mNumIndices;
                    hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
                        tmp = static_cast<uint32_t>( f.mIndices[i] );
                        hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    }
                }
                Write<unsigned int>(&chunk,hash);
            }
        }
        else // else write as usual
        {
            // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
            for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
                const aiFace& f = mesh->mFaces[i];

                static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
                Write<uint16_t>(&chunk,f.mNumIndices);

                for (unsigned int a = 0; a < f.mNumIndices;++a) {
                    if (mesh->mNumVertices < (1u<<16)) {
                        Write<uint16_t>(&chunk,f.mIndices[a]);
                    }
                    else Write<unsigned int>(&chunk,f.mIndices[a]);
                }
            }
        }

        // write bones
        if (mesh->mNumBones) {
            for (unsigned int a = 0; a < mesh->mNumBones;++a) {
                const aiBone* b = mesh->mBones[a];
                WriteBinaryBone(&chunk,b);
            }
        }
    }